

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iReParser.cpp
# Opt level: O2

double __thiscall iReParser::brackets(iReParser *this)

{
  bool bVar1;
  iReParser *this_00;
  double dVar2;
  
  this_00 = (iReParser *)&this->_token;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,"(");
  if (!bVar1) {
    dVar2 = atom(this);
    return dVar2;
  }
  nextToken(this);
  dVar2 = add_sub(this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,")");
  if (!bVar1) {
    nextToken(this);
    return dVar2;
  }
  handleErr(this_00,1);
}

Assistant:

double iReParser::brackets()
{
    double result;
    if(_token == "(") {
        nextToken();
        result = add_sub();
        if(_token != ")")
            handleErr(NOMATCH);
        nextToken();
    }
    else result = atom();
    return result;
}